

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# addrman.cpp
# Opt level: O0

size_t __thiscall AddrManImpl::Size_(AddrManImpl *this,optional<Network> net,optional<bool> in_new)

{
  long lVar1;
  size_type sVar2;
  bool bVar3;
  bool *pbVar4;
  pointer pvVar5;
  long in_RDI;
  long in_FS_OFFSET;
  NewTriedCount net_count;
  const_iterator it;
  undefined4 in_stack_ffffffffffffff88;
  int in_stack_ffffffffffffff8c;
  unordered_map<Network,_AddrManImpl::NewTriedCount,_std::hash<Network>,_std::equal_to<Network>,_std::allocator<std::pair<const_Network,_AddrManImpl::NewTriedCount>_>_>
  *in_stack_ffffffffffffff90;
  _Node_iterator_base<std::pair<const_Network,_AddrManImpl::NewTriedCount>,_false>
  *in_stack_ffffffffffffff98;
  int local_54;
  size_type local_40;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  AssertLockHeldInternal<AnnotatedMixin<std::mutex>>
            ((char *)in_stack_ffffffffffffff98,(char *)in_stack_ffffffffffffff90,
             in_stack_ffffffffffffff8c,(AnnotatedMixin<std::mutex> *)0x88240a);
  bVar3 = std::optional<Network>::has_value
                    ((optional<Network> *)
                     CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
  if (bVar3) {
    std::optional<Network>::operator*
              ((optional<Network> *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
    std::
    unordered_map<Network,_AddrManImpl::NewTriedCount,_std::hash<Network>,_std::equal_to<Network>,_std::allocator<std::pair<const_Network,_AddrManImpl::NewTriedCount>_>_>
    ::find(in_stack_ffffffffffffff90,
           (key_type *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
    std::
    unordered_map<Network,_AddrManImpl::NewTriedCount,_std::hash<Network>,_std::equal_to<Network>,_std::allocator<std::pair<const_Network,_AddrManImpl::NewTriedCount>_>_>
    ::end(in_stack_ffffffffffffff90);
    bVar3 = std::__detail::operator==
                      (in_stack_ffffffffffffff98,
                       (_Node_iterator_base<std::pair<const_Network,_AddrManImpl::NewTriedCount>,_false>
                        *)in_stack_ffffffffffffff90);
    if (((bVar3 ^ 0xffU) & 1) == 0) {
      local_40 = 0;
    }
    else {
      pvVar5 = std::__detail::
               _Node_const_iterator<std::pair<const_Network,_AddrManImpl::NewTriedCount>,_false,_false>
               ::operator->((_Node_const_iterator<std::pair<const_Network,_AddrManImpl::NewTriedCount>,_false,_false>
                             *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
      sVar2 = (pvVar5->second).n_new;
      local_40 = (pvVar5->second).n_tried;
      bVar3 = std::optional<bool>::has_value
                        ((optional<bool> *)
                         CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
      if (bVar3) {
        pbVar4 = std::optional<bool>::operator*
                           ((optional<bool> *)
                            CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
        if ((*pbVar4 & 1U) != 0) {
          local_40 = sVar2;
        }
      }
      else {
        local_40 = sVar2 + local_40;
      }
    }
  }
  else {
    bVar3 = std::optional<bool>::has_value
                      ((optional<bool> *)
                       CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
    if (bVar3) {
      pbVar4 = std::optional<bool>::operator*
                         ((optional<bool> *)
                          CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
      if ((*pbVar4 & 1U) == 0) {
        local_54 = *(int *)(in_RDI + 0x170);
      }
      else {
        local_54 = *(int *)(in_RDI + 0x20178);
      }
      local_40 = (long)local_54;
    }
    else {
      local_40 = std::vector<long,_std::allocator<long>_>::size
                           ((vector<long,_std::allocator<long>_> *)
                            CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return local_40;
}

Assistant:

size_t AddrManImpl::Size_(std::optional<Network> net, std::optional<bool> in_new) const
{
    AssertLockHeld(cs);

    if (!net.has_value()) {
        if (in_new.has_value()) {
            return *in_new ? nNew : nTried;
        } else {
            return vRandom.size();
        }
    }
    if (auto it = m_network_counts.find(*net); it != m_network_counts.end()) {
        auto net_count = it->second;
        if (in_new.has_value()) {
            return *in_new ? net_count.n_new : net_count.n_tried;
        } else {
            return net_count.n_new + net_count.n_tried;
        }
    }
    return 0;
}